

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O3

SinkResultType __thiscall
duckdb::PhysicalRecursiveCTE::Sink
          (PhysicalRecursiveCTE *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  mutex *__mutex;
  RecursiveCTEState *state;
  int iVar1;
  Allocator *pAVar2;
  pointer this_00;
  idx_t iVar3;
  PhysicalRecursiveCTE *this_01;
  DataChunk payload_rows;
  DataChunk distinct_rows;
  DataChunk local_a0;
  DataChunk local_60;
  
  state = (RecursiveCTEState *)input->global_state;
  __mutex = &state->intermediate_table_lock;
  this_01 = (PhysicalRecursiveCTE *)__mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    if (this->using_key == false) {
      if (this->union_all == false) {
        iVar3 = ProbeHT(this_01,chunk,state);
        if (iVar3 != 0) {
          ColumnDataCollection::Append(&state->intermediate_table,chunk);
        }
      }
      else {
        ColumnDataCollection::Append(&state->intermediate_table,chunk);
      }
    }
    else {
      DataChunk::DataChunk(&local_60);
      pAVar2 = Allocator::DefaultAllocator();
      DataChunk::Initialize(&local_60,pAVar2,&this->distinct_types,0x800);
      PopulateChunk(&local_60,chunk,&this->distinct_idx,true);
      DataChunk::DataChunk(&local_a0);
      if ((this->payload_types).
          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->payload_types).
          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pAVar2 = Allocator::DefaultAllocator();
        DataChunk::Initialize(&local_a0,pAVar2,&this->payload_types,0x800);
      }
      PopulateChunk(&local_a0,chunk,&this->payload_idx,true);
      this_00 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                ::operator->(&state->ht);
      GroupedAggregateHashTable::AddChunk(this_00,&local_60,&local_a0,NON_DISTINCT);
      ColumnDataCollection::Append(&state->intermediate_table,chunk);
      DataChunk::~DataChunk(&local_a0);
      DataChunk::~DataChunk(&local_60);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return NEED_MORE_INPUT;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

SinkResultType PhysicalRecursiveCTE::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<RecursiveCTEState>();

	lock_guard<mutex> guard(gstate.intermediate_table_lock);
	if (!using_key) {
		if (!union_all) {
			idx_t match_count = ProbeHT(chunk, gstate);
			if (match_count > 0) {
				gstate.intermediate_table.Append(chunk);
			}
		} else {
			gstate.intermediate_table.Append(chunk);
		}
	} else {
		// Split incoming DataChunk into payload and keys
		DataChunk distinct_rows;
		distinct_rows.Initialize(Allocator::DefaultAllocator(), distinct_types);
		PopulateChunk(distinct_rows, chunk, distinct_idx, true);
		DataChunk payload_rows;
		if (!payload_types.empty()) {
			payload_rows.Initialize(Allocator::DefaultAllocator(), payload_types);
		}
		PopulateChunk(payload_rows, chunk, payload_idx, true);

		// Add the chunk to the hash table and append it to the intermediate table
		gstate.ht->AddChunk(distinct_rows, payload_rows, AggregateType::NON_DISTINCT);
		gstate.intermediate_table.Append(chunk);
	}

	return SinkResultType::NEED_MORE_INPUT;
}